

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

bool test::operator==(NsPerson *a,NsPerson *b)

{
  __type _Var1;
  
  if (a->age == b->age) {
    _Var1 = std::operator==(&a->name,&b->name);
    return _Var1;
  }
  return false;
}

Assistant:

bool operator==(const NsPerson& a, const NsPerson& b)
  {
    return a.age == b.age && a.name == b.name;
  }